

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::mousePressEventHandler
          (QGraphicsScenePrivate *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Int IVar4;
  FocusPolicy FVar5;
  PanelModality PVar6;
  Type TVar7;
  MouseButton MVar8;
  DragMode DVar9;
  Int IVar10;
  QGraphicsWidget *pQVar11;
  QGraphicsItemPrivate *pQVar12;
  QGraphicsScenePrivate *pQVar13;
  QGraphicsItem **ppQVar14;
  QWidget *pQVar15;
  QGraphicsView *pQVar16;
  QGraphicsScenePrivate *pQVar17;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int iVar18;
  QGraphicsItem *in_RSI;
  QGraphicsScenePrivate *in_RDI;
  long in_FS_OFFSET;
  bool extendSelection;
  bool dontClearSelection;
  QGraphicsView *view;
  bool dontSendUngrabEvents;
  bool isPanel;
  bool disabled;
  add_const_t<QList<QGraphicsItem_*>_> *__range1_2;
  QGraphicsItem *modalPanel;
  add_const_t<QList<QGraphicsItem_*>_> *__range1_1;
  bool sceneModality;
  QGraphicsItem *item;
  add_const_t<QList<QGraphicsItem_*>_> *__range1;
  bool setFocus;
  QGraphicsWidget *newActiveWindow;
  QGraphicsScene *q;
  QGraphicsSceneMouseEvent mousePress;
  QGraphicsItem *item_1;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QGraphicsItem *topItem;
  undefined4 in_stack_fffffffffffffde8;
  KeyboardModifier in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  FocusReason in_stack_fffffffffffffdf4;
  FocusReason FVar19;
  FocusReason FVar20;
  QGraphicsItem *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  QGraphicsItem *pQVar21;
  MouseButton button;
  undefined4 in_stack_fffffffffffffe10;
  QGraphicsItem *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  MouseButton in_stack_fffffffffffffe24;
  QGraphicsItem *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  MouseButton in_stack_fffffffffffffe34;
  QGraphicsItem *in_stack_fffffffffffffe38;
  MouseButton button_00;
  QPoint *in_stack_fffffffffffffe40;
  QGraphicsScenePrivate *in_stack_fffffffffffffe48;
  QGraphicsScenePrivate *pQVar22;
  QGraphicsItem ***in_stack_fffffffffffffe50;
  QGraphicsScenePrivate *in_stack_fffffffffffffe58;
  QGraphicsWidget *local_190;
  QGraphicsWidget *local_188;
  QGraphicsWidget *local_120;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_fc;
  QPoint local_f8;
  QPointF local_f0;
  QPointF local_e0;
  QPointF local_d0;
  QPoint local_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_a0;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_9c;
  QGraphicsItem *local_98;
  QGraphicsItem **local_90;
  const_iterator local_88;
  const_iterator local_80;
  QGraphicsItem **local_78;
  const_iterator local_70;
  const_iterator local_68;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_60;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_5c;
  QGraphicsItem **local_58;
  const_iterator local_50;
  const_iterator local_48;
  QGraphicsItem *local_40;
  QPointF local_38;
  QPoint local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QEvent::ignore((QEvent *)in_RSI);
  bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9c7fda);
  if (bVar1) {
    bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9c8037);
    if (bVar1) {
      local_28 = QGraphicsSceneMouseEvent::screenPos
                           ((QGraphicsSceneMouseEvent *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      local_38 = QGraphicsSceneMouseEvent::scenePos
                           ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffdf8);
      QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9c8081);
      itemsAtPosition(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                      (QPointF *)in_stack_fffffffffffffe38,
                      (QWidget *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      QList<QGraphicsItem_*>::operator=
                ((QList<QGraphicsItem_*> *)
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (QList<QGraphicsItem_*> *)
                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9c80d2);
    }
    local_40 = QList<QGraphicsItem_*>::value
                         ((QList<QGraphicsItem_*> *)
                          CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                          CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    if (local_40 == (QGraphicsItem *)0x0) {
      local_188 = (QGraphicsWidget *)0x0;
    }
    else {
      local_188 = QGraphicsItem::window(in_stack_fffffffffffffdf8);
    }
    local_120 = local_188;
    if ((local_188 != (QGraphicsWidget *)0x0) &&
       (bVar1 = QGraphicsItem::isBlockedByModalPanel
                          (in_stack_fffffffffffffe28,
                           (QGraphicsItem **)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)), bVar1)) {
      if (local_40 == (QGraphicsItem *)0x0) {
        local_190 = (QGraphicsWidget *)0x0;
      }
      else {
        local_190 = QGraphicsItem::window(in_stack_fffffffffffffdf8);
      }
      local_120 = local_190;
    }
    pQVar11 = QGraphicsScene::activeWindow((QGraphicsScene *)in_stack_fffffffffffffdf8);
    if (local_120 != pQVar11) {
      QGraphicsScene::setActiveWindow
                ((QGraphicsScene *)in_stack_fffffffffffffe28,
                 (QGraphicsWidget *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    }
    bVar1 = false;
    local_48.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = QList<QGraphicsItem_*>::begin
                         ((QList<QGraphicsItem_*> *)
                          CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_50.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_50 = QList<QGraphicsItem_*>::end
                         ((QList<QGraphicsItem_*> *)
                          CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    while( true ) {
      local_58 = local_50.i;
      bVar2 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_48,local_50);
      if (!bVar2) break;
      ppQVar14 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_48);
      pQVar17 = (QGraphicsScenePrivate *)*ppQVar14;
      bVar2 = QGraphicsItem::isBlockedByModalPanel
                        (in_stack_fffffffffffffe28,
                         (QGraphicsItem **)
                         CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      if ((bVar2) ||
         (pQVar12 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                  *)&pQVar17->field_0x8),
         (*(ulong *)&pQVar12->field_0x160 & 0x4000000000000) != 0)) {
        bVar1 = true;
        break;
      }
      bVar3 = QGraphicsItem::isEnabled((QGraphicsItem *)0x9c82f3);
      bVar2 = false;
      if (bVar3) {
        local_60.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
             (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
             QGraphicsItem::flags
                       ((QGraphicsItem *)
                        CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
        local_5c.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
             (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
             QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                       ((QFlags<QGraphicsItem::GraphicsItemFlag> *)
                        CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                        in_stack_fffffffffffffdec);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5c);
        bVar2 = IVar4 != 0;
      }
      if (bVar2) {
        bVar2 = QGraphicsItem::isWidget((QGraphicsItem *)0x9c8360);
        if (bVar2) {
          if (pQVar17 == (QGraphicsScenePrivate *)0x0) {
            in_stack_fffffffffffffe50 = (QGraphicsItem ***)0x0;
          }
          else {
            in_stack_fffffffffffffe50 = &pQVar17[-1].modalPanels.d.ptr;
          }
          in_stack_fffffffffffffe58 = pQVar17;
          FVar5 = QGraphicsWidget::focusPolicy
                            ((QGraphicsWidget *)
                             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          if ((FVar5 & ClickFocus) == NoFocus) goto LAB_009c840f;
        }
        bVar1 = true;
        pQVar22 = pQVar17;
        pQVar13 = (QGraphicsScenePrivate *)
                  QGraphicsScene::focusItem
                            ((QGraphicsScene *)
                             CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
        if ((pQVar22 != pQVar13) &&
           (pQVar12 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                      ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                    *)&pQVar17->field_0x8),
           (*(uint *)&pQVar12->field_0x168 >> 1 & 1) != 0)) {
          QGraphicsScene::setFocusItem
                    ((QGraphicsScene *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00)
                     ,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
        }
        break;
      }
LAB_009c840f:
      bVar2 = QGraphicsItem::isPanel((QGraphicsItem *)0x9c841c);
      if ((bVar2) ||
         (pQVar12 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                                  *)&pQVar17->field_0x8),
         (*(ulong *)&pQVar12->field_0x160 & 0x2000000000000) != 0)) break;
      QList<QGraphicsItem_*>::const_iterator::operator++(&local_48);
    }
    bVar2 = false;
    local_68.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = QList<QGraphicsItem_*>::begin
                         ((QList<QGraphicsItem_*> *)
                          CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_70.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_70 = QList<QGraphicsItem_*>::end
                         ((QList<QGraphicsItem_*> *)
                          CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    while( true ) {
      local_78 = local_70.i;
      bVar3 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_68,local_70);
      if (!bVar3) break;
      QList<QGraphicsItem_*>::const_iterator::operator*(&local_68);
      PVar6 = QGraphicsItem::panelModality((QGraphicsItem *)0x9c852e);
      if (PVar6 == SceneModal) {
        bVar2 = true;
        break;
      }
      QList<QGraphicsItem_*>::const_iterator::operator++(&local_68);
    }
    if ((((*(uint *)&in_RDI->field_0xb8 >> 9 & 1) == 0) && (!bVar1)) && (!bVar2)) {
      QGraphicsScene::setFocusItem
                ((QGraphicsScene *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
    }
    if ((bVar2) &&
       (bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9c85ac), bVar1)) {
      QList<QGraphicsItem_*>::constFirst
                ((QList<QGraphicsItem_*> *)
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      QList<QGraphicsItem_*>::operator<<
                ((QList<QGraphicsItem_*> *)
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (parameter_type)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    }
    pQVar17 = (QGraphicsScenePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_80.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_80 = QList<QGraphicsItem_*>::begin
                         ((QList<QGraphicsItem_*> *)
                          CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_88.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = QList<QGraphicsItem_*>::end
                         ((QList<QGraphicsItem_*> *)
                          CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    while( true ) {
      local_90 = local_88.i;
      bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_80,local_88);
      if (!bVar1) break;
      ppQVar14 = QList<QGraphicsItem_*>::const_iterator::operator*(&local_80);
      local_98 = *ppQVar14;
      local_a0.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QGraphicsItem::acceptedMouseButtons
                     ((QGraphicsItem *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0)
                     );
      QGraphicsSceneMouseEvent::button
                ((QGraphicsSceneMouseEvent *)
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      local_9c.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QFlags<Qt::MouseButton>::operator&
                     ((QFlags<Qt::MouseButton> *)
                      CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                      in_stack_fffffffffffffdec);
      bVar1 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_9c);
      if (!bVar1) {
        QGraphicsItem::isBlockedByModalPanel
                  (in_stack_fffffffffffffe28,
                   (QGraphicsItem **)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        iVar18 = (int)local_98;
        grabMouse((QGraphicsScenePrivate *)
                  CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                  (QGraphicsItem *)local_120,SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
        QEvent::accept((QEvent *)in_RSI,iVar18,__addr,(socklen_t *)pQVar17);
        bVar1 = QGraphicsItem::isEnabled((QGraphicsItem *)0x9c872f);
        bVar2 = QGraphicsItem::isPanel((QGraphicsItem *)0x9c8747);
        TVar7 = QEvent::type((QEvent *)in_RSI);
        button_00 = (MouseButton)((ulong)in_stack_fffffffffffffe38 >> 0x20);
        if (((TVar7 == GraphicsSceneMouseDoubleClick) &&
            (pQVar17 = in_RDI, local_98 != in_RDI->lastMouseGrabberItem)) &&
           (in_RDI->lastMouseGrabberItem != (QGraphicsItem *)0x0)) {
          local_b8 = &DAT_aaaaaaaaaaaaaaaa;
          local_b0 = &DAT_aaaaaaaaaaaaaaaa;
          local_a8 = &DAT_aaaaaaaaaaaaaaaa;
          iVar18 = 0x9c;
          QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                     (Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
          bVar3 = QEvent::spontaneous((QEvent *)in_RSI);
          local_b0._0_4_ = CONCAT13(bVar3,(undefined3)local_b0);
          QEvent::accept((QEvent *)&local_b8,iVar18,__addr_00,(socklen_t *)pQVar17);
          QGraphicsSceneMouseEvent::button
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          QGraphicsSceneMouseEvent::setButton
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                     in_stack_fffffffffffffdec);
          QGraphicsSceneMouseEvent::buttons
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          QGraphicsSceneMouseEvent::setButtons
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                     (QFlagsStorageHelper<Qt::MouseButton,_4>)
                     SUB84((ulong)in_stack_fffffffffffffdf8 >> 0x20,0));
          local_c0 = QGraphicsSceneMouseEvent::screenPos
                               ((QGraphicsSceneMouseEvent *)
                                CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          QGraphicsSceneMouseEvent::setScreenPos
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          local_d0 = QGraphicsSceneMouseEvent::scenePos
                               ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffdf8);
          QGraphicsSceneMouseEvent::setScenePos
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                     (QPointF *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          QGraphicsSceneMouseEvent::modifiers
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          QGraphicsSceneMouseEvent::setModifiers
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                     (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                     SUB84((ulong)in_stack_fffffffffffffdf8 >> 0x20,0));
          QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9c88d4);
          QGraphicsSceneEvent::setWidget
                    ((QGraphicsSceneEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                     (QWidget *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          MVar8 = QGraphicsSceneMouseEvent::button
                            ((QGraphicsSceneMouseEvent *)
                             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          pQVar21 = in_RSI;
          QGraphicsSceneMouseEvent::button
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          button = (MouseButton)((ulong)pQVar21 >> 0x20);
          local_e0 = QGraphicsSceneMouseEvent::buttonDownPos
                               ((QGraphicsSceneMouseEvent *)
                                CONCAT44(MVar8,in_stack_fffffffffffffe10),button_00);
          QGraphicsSceneMouseEvent::setButtonDownPos
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),button,
                     (QPointF *)in_stack_fffffffffffffdf8);
          in_stack_fffffffffffffe24 =
               QGraphicsSceneMouseEvent::button
                         ((QGraphicsSceneMouseEvent *)
                          CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          in_stack_fffffffffffffe18 = in_RSI;
          QGraphicsSceneMouseEvent::button
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          local_f0 = QGraphicsSceneMouseEvent::buttonDownScenePos
                               ((QGraphicsSceneMouseEvent *)
                                CONCAT44(MVar8,in_stack_fffffffffffffe10),button_00);
          QGraphicsSceneMouseEvent::setButtonDownScenePos
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),button,
                     (QPointF *)in_stack_fffffffffffffdf8);
          in_stack_fffffffffffffe34 =
               QGraphicsSceneMouseEvent::button
                         ((QGraphicsSceneMouseEvent *)
                          CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          in_stack_fffffffffffffe28 = in_RSI;
          QGraphicsSceneMouseEvent::button
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
          local_f8 = QGraphicsSceneMouseEvent::buttonDownScreenPos
                               ((QGraphicsSceneMouseEvent *)
                                CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                                (MouseButton)((ulong)in_stack_fffffffffffffe18 >> 0x20));
          QGraphicsSceneMouseEvent::setButtonDownScreenPos
                    ((QGraphicsSceneMouseEvent *)
                     CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),button,
                     (QPoint *)in_stack_fffffffffffffdf8);
          sendMouseEvent(in_stack_fffffffffffffe58,
                         (QGraphicsSceneMouseEvent *)in_stack_fffffffffffffe50);
          in_stack_fffffffffffffe38 = in_RSI;
          bVar3 = QEvent::isAccepted((QEvent *)&local_b8);
          pQVar17 = (QGraphicsScenePrivate *)CONCAT71((int7)((ulong)pQVar17 >> 8),bVar3);
          (*in_stack_fffffffffffffe38->_vptr_QGraphicsItem[2])
                    (in_stack_fffffffffffffe38,(ulong)bVar3);
          QGraphicsSceneMouseEvent::~QGraphicsSceneMouseEvent((QGraphicsSceneMouseEvent *)0x9c8a52);
        }
        else {
          sendMouseEvent(in_stack_fffffffffffffe58,
                         (QGraphicsSceneMouseEvent *)in_stack_fffffffffffffe50);
        }
        bVar3 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9c8a7d);
        pQVar17 = (QGraphicsScenePrivate *)CONCAT71((int7)((ulong)pQVar17 >> 8),bVar3);
        in_stack_fffffffffffffe07 = true;
        if (!bVar3) {
          ppQVar14 = QList<QGraphicsItem_*>::constLast
                               ((QList<QGraphicsItem_*> *)
                                CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          in_stack_fffffffffffffe07 = *ppQVar14 != local_98;
        }
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          ungrabMouse((QGraphicsScenePrivate *)
                      CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                      (QGraphicsItem *)local_120,SUB81((ulong)in_stack_fffffffffffffe18 >> 0x38,0));
          break;
        }
        bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
        if (bVar1) {
          bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9c8b14);
          if (!bVar1) {
            storeMouseButtonsForMouseGrabber
                      ((QGraphicsScenePrivate *)
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (QGraphicsSceneMouseEvent *)in_stack_fffffffffffffe28);
          }
          in_RDI->lastMouseGrabberItem = local_98;
          goto LAB_009c8cb9;
        }
        ungrabMouse((QGraphicsScenePrivate *)
                    CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                    (QGraphicsItem *)local_120,SUB81((ulong)in_stack_fffffffffffffe18 >> 0x38,0));
        if (bVar2) break;
      }
      QList<QGraphicsItem_*>::const_iterator::operator++(&local_80);
    }
    bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
    if (!bVar1) {
      clearMouseGrabber((QGraphicsScenePrivate *)
                        CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      pQVar15 = QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9c8bb9);
      if (pQVar15 == (QWidget *)0x0) {
        pQVar16 = (QGraphicsView *)0x0;
      }
      else {
        QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9c8bcc);
        QWidget::parentWidget((QWidget *)0x9c8bd4);
        pQVar16 = qobject_cast<QGraphicsView*>((QObject *)0x9c8bdc);
      }
      FVar19 = in_stack_fffffffffffffdf4 & 0xffffff;
      if (pQVar16 != (QGraphicsView *)0x0) {
        DVar9 = QGraphicsView::dragMode
                          ((QGraphicsView *)
                           (CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0) &
                           0xffffffffffffff));
        FVar19 = CONCAT13(DVar9 == ScrollHandDrag,(int3)FVar19);
      }
      FVar20 = FVar19;
      QGraphicsSceneMouseEvent::modifiers
                ((QGraphicsSceneMouseEvent *)CONCAT44(FVar19,in_stack_fffffffffffffdf0));
      local_fc.super_QFlagsStorage<Qt::KeyboardModifier>.i =
           (QFlagsStorage<Qt::KeyboardModifier>)
           QFlags<Qt::KeyboardModifier>::operator&
                     ((QFlags<Qt::KeyboardModifier> *)CONCAT44(FVar20,in_stack_fffffffffffffdf0),
                      in_stack_fffffffffffffdec);
      IVar10 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_fc);
      if ((FVar19 & 0x1000000) == MouseFocusReason && IVar10 == 0) {
        QGraphicsScene::clearSelection
                  ((QGraphicsScene *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
      }
    }
  }
  else {
    QList<QGraphicsItem_*>::constLast
              ((QList<QGraphicsItem_*> *)
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    bVar1 = QGraphicsItem::isBlockedByModalPanel
                      (in_stack_fffffffffffffe28,
                       (QGraphicsItem **)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    if (!bVar1) {
      sendMouseEvent(in_stack_fffffffffffffe58,(QGraphicsSceneMouseEvent *)in_stack_fffffffffffffe50
                    );
    }
  }
LAB_009c8cb9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::mousePressEventHandler(QGraphicsSceneMouseEvent *mouseEvent)
{
    Q_Q(QGraphicsScene);

    // Ignore by default, unless we find a mouse grabber that accepts it.
    mouseEvent->ignore();

    // Deliver to any existing mouse grabber.
    if (!mouseGrabberItems.isEmpty()) {
        if (mouseGrabberItems.constLast()->isBlockedByModalPanel())
            return;
        // The event is ignored by default, but we disregard the event's
        // accepted state after delivery; the mouse is grabbed, after all.
        sendMouseEvent(mouseEvent);
        return;
    }

    // Start by determining the number of items at the current position.
    // Reuse value from earlier calculations if possible.
    if (cachedItemsUnderMouse.isEmpty()) {
        cachedItemsUnderMouse = itemsAtPosition(mouseEvent->screenPos(),
                                                mouseEvent->scenePos(),
                                                mouseEvent->widget());
    }

    // Update window activation.
    QGraphicsItem *topItem = cachedItemsUnderMouse.value(0);
    QGraphicsWidget *newActiveWindow = topItem ? topItem->window() : nullptr;
    if (newActiveWindow && newActiveWindow->isBlockedByModalPanel(&topItem)) {
        // pass activation to the blocking modal window
        newActiveWindow = topItem ? topItem->window() : nullptr;
    }

    if (newActiveWindow != q->activeWindow())
        q->setActiveWindow(newActiveWindow);

    // Set focus on the topmost enabled item that can take focus.
    bool setFocus = false;

    for (QGraphicsItem *item : std::as_const(cachedItemsUnderMouse)) {
        if (item->isBlockedByModalPanel()
            || (item->d_ptr->flags & QGraphicsItem::ItemStopsFocusHandling)) {
            // Make sure we don't clear focus.
            setFocus = true;
            break;
        }
        if (item->isEnabled() && ((item->flags() & QGraphicsItem::ItemIsFocusable))) {
            if (!item->isWidget() || ((QGraphicsWidget *)item)->focusPolicy() & Qt::ClickFocus) {
                setFocus = true;
                if (item != q->focusItem() && item->d_ptr->mouseSetsFocus)
                    q->setFocusItem(item, Qt::MouseFocusReason);
                break;
            }
        }
        if (item->isPanel())
            break;
        if (item->d_ptr->flags & QGraphicsItem::ItemStopsClickFocusPropagation)
            break;
    }

    // Check for scene modality.
    bool sceneModality = false;
    for (auto modalPanel : std::as_const(modalPanels)) {
        if (modalPanel->panelModality() == QGraphicsItem::SceneModal) {
            sceneModality = true;
            break;
        }
    }

    // If nobody could take focus, clear it.
    if (!stickyFocus && !setFocus && !sceneModality)
        q->setFocusItem(nullptr, Qt::MouseFocusReason);

    // Any item will do.
    if (sceneModality && cachedItemsUnderMouse.isEmpty())
        cachedItemsUnderMouse << modalPanels.constFirst();

    // Find a mouse grabber by sending mouse press events to all mouse grabber
    // candidates one at a time, until the event is accepted. It's accepted by
    // default, so the receiver has to explicitly ignore it for it to pass
    // through.
    for (QGraphicsItem *item : std::as_const(cachedItemsUnderMouse)) {
        if (!(item->acceptedMouseButtons() & mouseEvent->button())) {
            // Skip items that don't accept the event's mouse button.
            continue;
        }

        // Check if this item is blocked by a modal panel and deliver the mouse event to the
        // blocking panel instead of this item if blocked.
        (void) item->isBlockedByModalPanel(&item);

        grabMouse(item, /* implicit = */ true);
        mouseEvent->accept();

        // check if the item we are sending to are disabled (before we send the event)
        bool disabled = !item->isEnabled();
        bool isPanel = item->isPanel();
        if (mouseEvent->type() == QEvent::GraphicsSceneMouseDoubleClick
            && item != lastMouseGrabberItem && lastMouseGrabberItem) {
            // If this item is different from the item that received the last
            // mouse event, and mouseEvent is a double-click event, then the
            // event is converted to a press. Known limitation:
            // Triple-clicking will not generate a double-click, though.
            QGraphicsSceneMouseEvent mousePress(QEvent::GraphicsSceneMousePress);
            mousePress.m_spont = mouseEvent->spontaneous();
            mousePress.accept();
            mousePress.setButton(mouseEvent->button());
            mousePress.setButtons(mouseEvent->buttons());
            mousePress.setScreenPos(mouseEvent->screenPos());
            mousePress.setScenePos(mouseEvent->scenePos());
            mousePress.setModifiers(mouseEvent->modifiers());
            mousePress.setWidget(mouseEvent->widget());
            mousePress.setButtonDownPos(mouseEvent->button(),
                                        mouseEvent->buttonDownPos(mouseEvent->button()));
            mousePress.setButtonDownScenePos(mouseEvent->button(),
                                             mouseEvent->buttonDownScenePos(mouseEvent->button()));
            mousePress.setButtonDownScreenPos(mouseEvent->button(),
                                              mouseEvent->buttonDownScreenPos(mouseEvent->button()));
            sendMouseEvent(&mousePress);
            mouseEvent->setAccepted(mousePress.isAccepted());
        } else {
            sendMouseEvent(mouseEvent);
        }

        bool dontSendUngrabEvents = mouseGrabberItems.isEmpty() || mouseGrabberItems.constLast() != item;
        if (disabled) {
            ungrabMouse(item, /* itemIsDying = */ dontSendUngrabEvents);
            break;
        }
        if (mouseEvent->isAccepted()) {
            if (!mouseGrabberItems.isEmpty())
                storeMouseButtonsForMouseGrabber(mouseEvent);
            lastMouseGrabberItem = item;
            return;
        }
        ungrabMouse(item, /* itemIsDying = */ dontSendUngrabEvents);

        // Don't propagate through panels.
        if (isPanel)
            break;
    }

    // Is the event still ignored? Then the mouse press goes to the scene.
    // Reset the mouse grabber, clear the selection, clear focus, and leave
    // the event ignored so that it can propagate through the originating
    // view.
    if (!mouseEvent->isAccepted()) {
        clearMouseGrabber();

        QGraphicsView *view = mouseEvent->widget() ? qobject_cast<QGraphicsView *>(mouseEvent->widget()->parentWidget()) : 0;
        bool dontClearSelection = view && view->dragMode() == QGraphicsView::ScrollHandDrag;
        bool extendSelection = (mouseEvent->modifiers() & Qt::ControlModifier) != 0;
        dontClearSelection |= extendSelection;
        if (!dontClearSelection) {
            // Clear the selection if the originating view isn't in scroll
            // hand drag mode. The view will clear the selection if no drag
            // happened.
            q->clearSelection();
        }
    }
}